

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_array_remove(json_t *json,size_t index)

{
  json_t *json_00;
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if (((json != (json_t *)0x0) && (iVar1 = -1, json->type == JSON_ARRAY)) &&
     (index < json[1].refcount)) {
    json_00 = *(json_t **)(*(long *)(json + 2) + index * 8);
    if (((json_00 != (json_t *)0x0) && (json_00->refcount != 0xffffffffffffffff)) &&
       (sVar2 = json_00->refcount - 1, json_00->refcount = sVar2, sVar2 == 0)) {
      json_delete(json_00);
    }
    if (index < json[1].refcount - 1) {
      memmove((void *)(*(long *)(json + 2) + index * 8),
              (void *)(*(long *)(json + 2) + index * 8 + 8),(json[1].refcount + ~index) * 8);
    }
    json[1].refcount = json[1].refcount - 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_array_remove(json_t *json, size_t index)
{
	json_array_t *array;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	if (index >= array->entries)
		return -1;

	json_decref(array->table[index]);

	/* If we're removing the last element, nothing has to be moved */
	if (index < array->entries - 1)
		array_move(array, index, index + 1, array->entries - index - 1);

	array->entries--;

	return 0;
}